

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void groupConcatValue(sqlite3_context *context)

{
  sqlite3_context *pCtx;
  char *pcVar1;
  char *zText;
  StrAccum *pAccum;
  GroupConcatCtx *pGCC;
  sqlite3_context *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  int n;
  sqlite3_context *pCtx_00;
  
  n = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  pCtx = (sqlite3_context *)sqlite3_aggregate_context(in_stack_ffffffffffffffd8,0);
  if (pCtx != (sqlite3_context *)0x0) {
    if (*(char *)((long)&pCtx->pVdbe + 4) == '\x12') {
      sqlite3_result_error_toobig((sqlite3_context *)0x2260dc);
    }
    else if (*(char *)((long)&pCtx->pVdbe + 4) == '\a') {
      sqlite3_result_error_nomem((sqlite3_context *)0x2260f6);
    }
    else if ((pCtx->iOp < 1) || (*(int *)&pCtx->pVdbe != 0)) {
      pCtx_00 = pCtx;
      pcVar1 = sqlite3_str_value((sqlite3_str *)pCtx);
      sqlite3_result_text(pCtx_00,(char *)pCtx,(int)((ulong)pcVar1 >> 0x20),
                          (_func_void_void_ptr *)in_stack_ffffffffffffffd8);
    }
    else {
      sqlite3_result_text(pCtx,(char *)pCtx,n,(_func_void_void_ptr *)in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

static void groupConcatValue(sqlite3_context *context){
  GroupConcatCtx *pGCC
    = (GroupConcatCtx*)sqlite3_aggregate_context(context, 0);
  if( pGCC ){
    StrAccum *pAccum = &pGCC->str;
    if( pAccum->accError==SQLITE_TOOBIG ){
      sqlite3_result_error_toobig(context);
    }else if( pAccum->accError==SQLITE_NOMEM ){
      sqlite3_result_error_nomem(context);
    }else if( pGCC->nAccum>0 && pAccum->nChar==0 ){
      sqlite3_result_text(context, "", 1, SQLITE_STATIC);
    }else{
      const char *zText = sqlite3_str_value(pAccum);
      sqlite3_result_text(context, zText, pAccum->nChar, SQLITE_TRANSIENT);
    }
  }
}